

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall cooper::timer::thread_func(timer *this)

{
  bool bVar1;
  cv_status cVar2;
  rep rVar3;
  rep rVar4;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *ptVar5;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  to;
  undefined1 local_20 [8];
  unique_guard g;
  timer *this_local;
  
  g._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_20,(mutex_type *)(this + 0x30));
  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)(this + 0x88));
  if (rVar3 != 0) {
    rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)(this + 0x88));
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)(this + 0x90));
    if (rVar3 != rVar4) {
      cVar2 = std::condition_variable::wait_for<long,std::ratio<1l,1000000000l>>
                        ((condition_variable *)(this + 0x58),(unique_lock<std::mutex> *)local_20,
                         (duration<long,_std::ratio<1L,_1000000000L>_> *)(this + 0x88));
      if (cVar2 != no_timeout) {
        bVar1 = std::atomic::operator_cast_to_bool((atomic *)(this + 0x98));
        if (!bVar1) {
          std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
          std::function<void_()>::operator()((function<void_()> *)(this + 8));
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_20);
          goto LAB_0011c830;
        }
      }
      to.__d.__r._0_4_ = 1;
      goto LAB_0011c972;
    }
  }
LAB_0011c830:
  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)(this + 0x90));
  if (rVar3 == 0) {
    to.__d.__r._0_4_ = 1;
  }
  else {
    local_40.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_38 = std::chrono::operator+
                         (&local_40,(duration<long,_std::ratio<1L,_1000000000L>_> *)(this + 0x90));
    while( true ) {
      bVar1 = std::atomic::operator_cast_to_bool((atomic *)(this + 0x98));
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      cVar2 = std::condition_variable::
              wait_until<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        ((condition_variable *)(this + 0x58),(unique_lock<std::mutex> *)local_20,
                         &local_38);
      if (cVar2 == no_timeout) {
LAB_0011c8e0:
        to.__d.__r._0_4_ = 1;
        goto LAB_0011c972;
      }
      bVar1 = std::atomic::operator_cast_to_bool((atomic *)(this + 0x98));
      if (bVar1) goto LAB_0011c8e0;
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
      std::function<void_()>::operator()((function<void_()> *)(this + 8));
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_20);
      local_48 = std::chrono::operator+
                           (&local_38,(duration<long,_std::ratio<1L,_1000000000L>_> *)(this + 0x90))
      ;
      local_50.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      ptVar5 = std::
               max<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                         (&local_48,&local_50);
      local_38.__d.__r = (duration)(ptVar5->__d).__r;
    }
    to.__d.__r._0_4_ = 0;
  }
LAB_0011c972:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void timer::thread_func()
{
	unique_guard g(lock_);
	if (initTime_.count() != 0 && initTime_.count() != interval_.count()) {
		if (cond_.wait_for(g, initTime_) == cv_status::no_timeout || quit_)
			return;
		g.unlock();
		func_();
		g.lock();
	}

	// If this was a one-shot, get out now.
	if (interval_.count() == 0)
		return;

	auto to = steady_clock::now() + interval_;

	while (!quit_) {
		if (cond_.wait_until(g, to) == cv_status::no_timeout || quit_)
			return;
		g.unlock();
		func_();
		g.lock();
		to = std::max(to+interval_, steady_clock::now());
	}
}